

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

exr_attribute_t * __thiscall Imf_3_3::Context::getAttr(Context *this,int partidx,char *name)

{
  exr_result_t eVar1;
  ostream *poVar2;
  char *pcVar3;
  stringstream *text;
  char *in_RDX;
  int in_ESI;
  stringstream _iex_throw_s;
  exr_result_t res;
  exr_attribute_t *attr;
  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe00;
  exr_attribute_t **in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  int part_index;
  exr_const_context_t in_stack_fffffffffffffe28;
  stringstream local_1b0 [16];
  ostream local_1a0 [320];
  Context *in_stack_ffffffffffffffa0;
  
  part_index = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  std::__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffe00);
  eVar1 = exr_get_attribute_by_name
                    (in_stack_fffffffffffffe28,part_index,in_stack_fffffffffffffe18,
                     in_stack_fffffffffffffe10);
  if ((eVar1 != 0) && (eVar1 != 0xf)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar2 = std::operator<<(local_1a0,"Unable to find attribute \'");
    poVar2 = std::operator<<(poVar2,in_RDX);
    poVar2 = std::operator<<(poVar2,"\' for part ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
    poVar2 = std::operator<<(poVar2," in file \'");
    pcVar3 = fileName(in_stack_ffffffffffffffa0);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\'");
    text = (stringstream *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)poVar2,text);
    __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  return (exr_attribute_t *)0x0;
}

Assistant:

const exr_attribute_t*
Context::getAttr (int partidx, const char* name) const
{
    const exr_attribute_t* attr = nullptr;
    exr_result_t           res;

    res = exr_get_attribute_by_name (*_ctxt, partidx, name, &attr);

    if (res == EXR_ERR_SUCCESS || res == EXR_ERR_NO_ATTR_BY_NAME) return attr;

    THROW (
        IEX_NAMESPACE::ArgExc,
        "Unable to find attribute '" << name << "' for part " << partidx
                                     << " in file '" << fileName () << "'");
}